

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathParseName(xmlXPathParserContextPtr ctxt)

{
  byte bVar1;
  byte *cur;
  xmlChar *pxVar2;
  ulong uVar3;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (cur = ctxt->cur, cur == (byte *)0x0)) {
    return (xmlChar *)0x0;
  }
  bVar1 = *cur;
  if ((((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) || (bVar1 == 0x5f)) || (bVar1 == 0x3a)) {
    uVar3 = 1;
    while (((bVar1 = cur[uVar3], (byte)(bVar1 - 0x30) < 10 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)
            ) || ((bVar1 - 0x2d < 0x33 &&
                  ((0x4000000002003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0))))) {
      uVar3 = uVar3 + 1;
    }
    if ((bVar1 != 0) && (-1 < (char)bVar1)) {
      if (50000 < uVar3) {
        ctxt->cur = cur + uVar3;
        xmlXPathErr(ctxt,7);
        return (xmlChar *)0x0;
      }
      pxVar2 = xmlStrndup(cur,(int)uVar3);
      if (pxVar2 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      ctxt->cur = cur + uVar3;
      return pxVar2;
    }
  }
  pxVar2 = xmlXPathParseNameComplex(ctxt,1);
  return pxVar2;
}

Assistant:

xmlChar *
xmlXPathParseName(xmlXPathParserContextPtr ctxt) {
    const xmlChar *in;
    xmlChar *ret;
    size_t count = 0;

    if ((ctxt == NULL) || (ctxt->cur == NULL)) return(NULL);
    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->cur;
    if (((*in >= 0x61) && (*in <= 0x7A)) ||
	((*in >= 0x41) && (*in <= 0x5A)) ||
	(*in == '_') || (*in == ':')) {
	in++;
	while (((*in >= 0x61) && (*in <= 0x7A)) ||
	       ((*in >= 0x41) && (*in <= 0x5A)) ||
	       ((*in >= 0x30) && (*in <= 0x39)) ||
	       (*in == '_') || (*in == '-') ||
	       (*in == ':') || (*in == '.'))
	    in++;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->cur;
            if (count > XML_MAX_NAME_LENGTH) {
                ctxt->cur = in;
                XP_ERRORNULL(XPATH_EXPR_ERROR);
            }
	    ret = xmlStrndup(ctxt->cur, count);
            if (ret == NULL)
                xmlXPathPErrMemory(ctxt);
	    ctxt->cur = in;
	    return(ret);
	}
    }
    return(xmlXPathParseNameComplex(ctxt, 1));
}